

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall
iqnet::Reactor<boost::mutex>::unregister_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  pointer pHVar4;
  const_iterator local_60;
  int local_58;
  int local_54;
  hs_iterator hStack_50;
  int newmask;
  _Self local_38;
  hs_iterator i;
  scoped_lock lk;
  Event_mask mask_local;
  Event_handler *eh_local;
  Reactor<boost::mutex> *this_local;
  
  boost::unique_lock<boost::mutex>::unique_lock((unique_lock<boost::mutex> *)&i,&this->lock);
  local_38._M_node = (_List_node_base *)find_handler_state(this,eh);
  hStack_50 = end(this);
  bVar1 = std::operator!=(&local_38,&stack0xffffffffffffffb0);
  if (bVar1) {
    pHVar4 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_38);
    uVar2 = pHVar4->mask & (ushort)((mask != 0 ^ 0xffU) & 1);
    pHVar4->mask = uVar2;
    local_54 = (int)(short)uVar2;
    if (local_54 == 0) {
      local_58 = (*eh->_vptr_Event_handler[9])();
      std::
      map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
      ::erase(&this->handlers,&local_58);
      std::_List_const_iterator<iqnet::Reactor_base::HandlerState>::_List_const_iterator
                (&local_60,&local_38);
      std::__cxx11::
      list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
      erase(&this->handlers_states,local_60);
      uVar3 = (*eh->_vptr_Event_handler[2])();
      if ((uVar3 & 1) != 0) {
        this->num_stoppers = this->num_stoppers - 1;
      }
    }
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)&i);
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);
  hs_iterator i = find_handler_state( eh );

  if( i != end() )
  {
    int newmask = (i->mask &= !mask);

    if( !newmask )
    {
      handlers.erase(eh->get_handler());
      handlers_states.erase(i);

      if (eh->is_stopper())
        num_stoppers--;
    }
  }
}